

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::TimezoneMinuteOperator>
               (interval_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  TemplatedValidityMask<unsigned_long> *pTVar2;
  reference input;
  ulong uVar3;
  TemplatedValidityMask<unsigned_long> *extraout_RDX;
  Vector *result;
  TemplatedValidityMask<unsigned_long> *pTVar4;
  ulong uVar5;
  interval_t input_00;
  interval_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
LAB_01cd6d92:
      input_00.micros = (int64_t)result_data;
      input_00._0_8_ = ldata;
      DatePart::TimezoneMinuteOperator::Operation<duckdb::interval_t,long>(input_00);
      if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
          (unsigned_long *)0x0) {
        if (extraout_RDX != (TemplatedValidityMask<unsigned_long> *)0x0) {
LAB_01cd6dfe:
          input_01.micros = (int64_t)result_data;
          input_01._0_8_ = ldata;
          DatePart::TimezoneMinuteOperator::Operation<duckdb::interval_t,long>(input_01);
          input = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)ldata,0);
          Execute<duckdb::interval_t,double,duckdb::DatePart::EpochOperator>
                    (input,result,((TemplatedValidityMask<unsigned_long> *)ldata)->capacity);
          return;
        }
      }
      else {
        for (pTVar4 = (TemplatedValidityMask<unsigned_long> *)0x0; extraout_RDX != pTVar4;
            pTVar4 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar4->validity_mask + 1)) {
          puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          pTVar2 = pTVar4;
          if (puVar1 != (unsigned_long *)0x0) {
            pTVar2 = (TemplatedValidityMask<unsigned_long> *)
                     (ulong)*(uint *)((long)puVar1 + (long)pTVar4 * 4);
          }
          if (((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
               [(ulong)pTVar2 >> 6] >> ((ulong)pTVar2 & 0x3f) & 1) != 0) goto LAB_01cd6dfe;
          result_data = (long *)pTVar4;
          ldata = (interval_t *)dataptr;
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)dataptr,(idx_t)pTVar4);
        }
      }
      return;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    mask = (ValidityMask *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    result_data = (long *)(TemplatedValidityMask<unsigned_long> *)0x0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      if (mask == (ValidityMask *)0x0) {
        ldata = (interval_t *)((long)result_data + 0x40);
        if (count <= (TemplatedValidityMask<unsigned_long> *)((long)result_data + 0x40)) {
          ldata = (interval_t *)count;
        }
LAB_01cd6d62:
        pTVar4 = (TemplatedValidityMask<unsigned_long> *)result_data;
        if (result_data < ldata) goto LAB_01cd6d92;
      }
      else {
        result_mask = (ValidityMask *)
                      (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)[uVar3];
        ldata = (interval_t *)((long)result_data + 0x40);
        if (count <= (TemplatedValidityMask<unsigned_long> *)((long)result_data + 0x40)) {
          ldata = (interval_t *)count;
        }
        if (result_mask == (ValidityMask *)0xffffffffffffffff) goto LAB_01cd6d62;
        pTVar4 = (TemplatedValidityMask<unsigned_long> *)ldata;
        if (result_mask != (ValidityMask *)0x0) {
          dataptr = ldata;
          if (ldata < result_data) {
            dataptr = result_data;
          }
          for (uVar5 = 0; pTVar4 = (TemplatedValidityMask<unsigned_long> *)dataptr,
              (TemplatedValidityMask<unsigned_long> *)
              ((long)&((TemplatedValidityMask<unsigned_long> *)result_data)->validity_mask + uVar5)
              < ldata; uVar5 = uVar5 + 1) {
            if (((ulong)result_mask >> (uVar5 & 0x3f) & 1) != 0) goto LAB_01cd6d92;
          }
        }
      }
      result_data = (long *)pTVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}